

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall
ft::deque<int,_ft::allocator<int>_>::push_back
          (deque<int,_ft::allocator<int>_> *this,value_type *val)

{
  map_pointer ppvVar1;
  pointer pvVar2;
  value_type *pvVar3;
  
  if ((this->m_finish).m_cur + 1 == (this->m_finish).m_last) {
    ppvVar1 = (this->m_finish).m_node;
    if (ppvVar1 == this->m_map + (this->m_map_size - 1)) {
      realloc(this,val,this->m_map_size);
      ppvVar1 = (this->m_finish).m_node;
    }
    if (ppvVar1[1] == (pointer)0x0) {
      pvVar2 = (pointer)operator_new(0x100);
      (this->m_finish).m_node[1] = pvVar2;
      this->m_chunks = this->m_chunks + 1;
    }
  }
  pvVar3 = (this->m_finish).m_cur;
  *pvVar3 = *val;
  pvVar3 = pvVar3 + 1;
  (this->m_finish).m_cur = pvVar3;
  if (pvVar3 == (this->m_finish).m_last) {
    ppvVar1 = (this->m_finish).m_node;
    (this->m_finish).m_node = ppvVar1 + 1;
    pvVar2 = ppvVar1[1];
    (this->m_finish).m_first = pvVar2;
    (this->m_finish).m_last = pvVar2 + 0x40;
    (this->m_finish).m_cur = pvVar2;
  }
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_back(value_type const & val) {
		if (this->m_finish.m_cur + 1 == this->m_finish.m_last) {
			if (this->m_finish.m_node == this->m_map + this->m_map_size - 1) {
				this->realloc();
			}
			if (*(this->m_finish.m_node + 1) == NULL) {
				*(this->m_finish.m_node + 1) = this->m_alloc.allocate(this->chunk_size());
				++this->m_chunks;
			}
		}
		this->m_alloc.construct(this->m_finish.m_cur, val);
		++this->m_finish;
		++this->m_size;
	}